

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

void __thiscall CPlayer::OnDirectInput(CPlayer *this,CNetObj_PlayerInput *NewInput)

{
  int iVar1;
  uint uVar2;
  CEntity *pCVar3;
  CFlag *pCVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar2 = NewInput->m_PlayerFlags;
  if ((this->m_pGameServer->m_World).m_Paused == true) {
LAB_00124460:
    this->m_PlayerFlags = uVar2;
    return;
  }
  if ((uVar2 & 2) != 0) {
    if ((this->m_PlayerFlags & 2) != 0) {
      return;
    }
    if (this->m_pCharacter != (CCharacter *)0x0) {
      CCharacter::ResetInput(this->m_pCharacter);
    }
    uVar2 = NewInput->m_PlayerFlags;
    goto LAB_00124460;
  }
  this->m_PlayerFlags = uVar2;
  if (this->m_pCharacter != (CCharacter *)0x0) {
    CCharacter::OnDirectInput(this->m_pCharacter,NewInput);
  }
  if (((this->m_pCharacter == (CCharacter *)0x0) && (this->m_Team != -1)) &&
     ((NewInput->m_Fire & 1) != 0)) {
    Respawn(this);
  }
  if (((this->m_pCharacter != (CCharacter *)0x0) || (this->m_Team != -1)) ||
     ((NewInput->m_Fire & 1) == 0)) {
    if (this->m_ActiveSpecSwitch == true) {
      this->m_ActiveSpecSwitch = false;
    }
    goto LAB_00124675;
  }
  if (this->m_ActiveSpecSwitch != false) goto LAB_00124675;
  this->m_ActiveSpecSwitch = true;
  if (this->m_SpecMode != 0) {
    this->m_SpecMode = 0;
    this->m_SpectatorID = -1;
    this->m_pSpecFlag = (CFlag *)0x0;
    goto LAB_00124675;
  }
  pCVar3 = CGameWorld::ClosestEntity
                     (&this->m_pGameServer->m_World,this->m_ViewPos,192.0,3,(CEntity *)0x0);
  pCVar4 = (CFlag *)CGameWorld::ClosestEntity
                              (&this->m_pGameServer->m_World,this->m_ViewPos,192.0,4,(CEntity *)0x0)
  ;
  if (pCVar3 == (CEntity *)0x0 && pCVar4 == (CFlag *)0x0) goto LAB_00124675;
  if (pCVar3 == (CEntity *)0x0) {
LAB_00124629:
    this->m_SpecMode = 3 - (uint)(pCVar4->m_Team == 0);
    this->m_pSpecFlag = pCVar4;
    this->m_SpectatorID = -1;
  }
  else {
    if (pCVar4 != (CFlag *)0x0) {
      fVar5 = (this->m_ViewPos).field_0.x - (pCVar4->super_CEntity).m_Pos.field_0.x;
      fVar6 = (this->m_ViewPos).field_1.y - (pCVar4->super_CEntity).m_Pos.field_1.y;
      fVar5 = fVar5 * fVar5 + fVar6 * fVar6;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      fVar6 = (this->m_ViewPos).field_0.x - (pCVar3->m_Pos).field_0.x;
      fVar7 = (this->m_ViewPos).field_1.y - (pCVar3->m_Pos).field_1.y;
      fVar6 = fVar6 * fVar6 + fVar7 * fVar7;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      if (fVar5 < fVar6) goto LAB_00124629;
    }
    this->m_SpecMode = 1;
    this->m_pSpecFlag = (CFlag *)0x0;
    this->m_SpectatorID = *(int *)((long)pCVar3[1]._vptr_CEntity + 0x404);
  }
LAB_00124675:
  if (((NewInput->m_Direction == 0) && ((this->m_LatestActivity).m_TargetX == NewInput->m_TargetX))
     && (((this->m_LatestActivity).m_TargetY == NewInput->m_TargetY &&
         (((NewInput->m_Jump == 0 && ((NewInput->m_Fire & 1) == 0)) && (NewInput->m_Hook == 0))))))
  {
    return;
  }
  iVar1 = NewInput->m_TargetY;
  (this->m_LatestActivity).m_TargetX = NewInput->m_TargetX;
  (this->m_LatestActivity).m_TargetY = iVar1;
  this->m_LastActionTick = this->m_pGameServer->m_pServer->m_CurrentGameTick;
  this->m_InactivityTickCounter = 0;
  return;
}

Assistant:

void CPlayer::OnDirectInput(CNetObj_PlayerInput *NewInput)
{
	if(GameServer()->m_World.m_Paused)
	{
		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	if(NewInput->m_PlayerFlags&PLAYERFLAG_CHATTING)
	{
		// skip the input if chat is active
		if(m_PlayerFlags&PLAYERFLAG_CHATTING)
			return;

		// reset input
		if(m_pCharacter)
			m_pCharacter->ResetInput();

		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	m_PlayerFlags = NewInput->m_PlayerFlags;

	if(m_pCharacter)
		m_pCharacter->OnDirectInput(NewInput);

	if(!m_pCharacter && m_Team != TEAM_SPECTATORS && (NewInput->m_Fire&1))
		Respawn();

	if(!m_pCharacter && m_Team == TEAM_SPECTATORS && (NewInput->m_Fire&1))
	{
		if(!m_ActiveSpecSwitch)
		{
			m_ActiveSpecSwitch = true;
			if(m_SpecMode == SPEC_FREEVIEW)
			{
				CCharacter *pChar = (CCharacter *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_CHARACTER, 0);
				CFlag *pFlag = (CFlag *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_FLAG, 0);
				if(pChar || pFlag)
				{
					if(!pChar || (pFlag && pChar && distance(m_ViewPos, pFlag->GetPos()) < distance(m_ViewPos, pChar->GetPos())))
					{
						m_SpecMode = pFlag->GetTeam() == TEAM_RED ? SPEC_FLAGRED : SPEC_FLAGBLUE;
						m_pSpecFlag = pFlag;
						m_SpectatorID = -1;
					}
					else
					{
						m_SpecMode = SPEC_PLAYER;
						m_pSpecFlag = 0;
						m_SpectatorID = pChar->GetPlayer()->GetCID();
					}
				}
			}
			else
			{
				m_SpecMode = SPEC_FREEVIEW;
				m_pSpecFlag = 0;
				m_SpectatorID = -1;
			}
		}
	}
	else if(m_ActiveSpecSwitch)
		m_ActiveSpecSwitch = false;

	// check for activity
	if(NewInput->m_Direction || m_LatestActivity.m_TargetX != NewInput->m_TargetX ||
		m_LatestActivity.m_TargetY != NewInput->m_TargetY || NewInput->m_Jump ||
		NewInput->m_Fire&1 || NewInput->m_Hook)
	{
		m_LatestActivity.m_TargetX = NewInput->m_TargetX;
		m_LatestActivity.m_TargetY = NewInput->m_TargetY;
		m_LastActionTick = Server()->Tick();
		m_InactivityTickCounter = 0;
	}
}